

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O3

libcaption_stauts_t caption_frame_decode_midrowchange(caption_frame_t *frame,uint16_t cc_data)

{
  int iVar1;
  int unl;
  eia608_style_t sty;
  int chn;
  byte local_14 [4];
  undefined1 local_10 [4];
  int local_c;
  
  iVar1 = eia608_parse_midrowchange(cc_data,&local_c,(eia608_style_t *)local_10,(int *)local_14);
  if (iVar1 != 0) {
    *(byte *)&frame->state =
         local_14[0] & 1 | *(byte *)&frame->state & 0xf0 | local_10[0] * '\x02' & 0xeU;
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t caption_frame_decode_midrowchange(caption_frame_t* frame, uint16_t cc_data)
{
    eia608_style_t sty;
    int chn, unl;

    if (eia608_parse_midrowchange(cc_data, &chn, &sty, &unl)) {
        frame->state.sty = sty;
        frame->state.uln = unl;
    }

    return LIBCAPTION_OK;
}